

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void prune_rect_part_using_none_pred_mode
               (MACROBLOCKD *xd,PartitionSearchState *part_state,PREDICTION_MODE mode,
               BLOCK_SIZE bsize)

{
  _Bool _Var1;
  BLOCK_SIZE in_CL;
  char in_DL;
  long in_RSI;
  MACROBLOCKD *in_RDI;
  
  if ((in_DL == '\0') || (in_DL == '\t')) {
    _Var1 = is_neighbor_blk_larger_than_cur_blk(in_RDI,in_CL);
    if (_Var1) {
      *(undefined4 *)(in_RSI + 0x130) = 1;
      *(undefined4 *)(in_RSI + 0x134) = 1;
    }
  }
  else if (((in_DL == '\b') || (in_DL == '\x01')) || (in_DL == '\x05')) {
    *(undefined4 *)(in_RSI + 0x130) = 1;
  }
  else if (((in_DL == '\x06') || (in_DL == '\x02')) || (in_DL == '\a')) {
    *(undefined4 *)(in_RSI + 0x134) = 1;
  }
  return;
}

Assistant:

static inline void prune_rect_part_using_none_pred_mode(
    const MACROBLOCKD *xd, PartitionSearchState *part_state,
    PREDICTION_MODE mode, BLOCK_SIZE bsize) {
  if (mode == DC_PRED || mode == SMOOTH_PRED) {
    // If the prediction mode of NONE partition is either DC_PRED or
    // SMOOTH_PRED, it indicates that the current block has less variation. In
    // this case, HORZ and VERT partitions are pruned if at least one of left
    // and top neighbor blocks is larger than the current block.
    if (is_neighbor_blk_larger_than_cur_blk(xd, bsize)) {
      part_state->prune_rect_part[HORZ] = 1;
      part_state->prune_rect_part[VERT] = 1;
    }
  } else if (mode == D67_PRED || mode == V_PRED || mode == D113_PRED) {
    // If the prediction mode chosen by NONE partition is close to 90 degrees,
    // it implies a dominant vertical pattern, and the chance of choosing a
    // vertical rectangular partition is high. Hence, horizontal partition is
    // pruned in these cases.
    part_state->prune_rect_part[HORZ] = 1;
  } else if (mode == D157_PRED || mode == H_PRED || mode == D203_PRED) {
    // If the prediction mode chosen by NONE partition is close to 180 degrees,
    // it implies a dominant horizontal pattern, and the chance of choosing a
    // horizontal rectangular partition is high. Hence, vertical partition is
    // pruned in these cases.
    part_state->prune_rect_part[VERT] = 1;
  }
}